

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O2

CBString * efiTimeToUString(CBString *__return_storage_ptr__,EFI_TIME *time)

{
  usprintf(__return_storage_ptr__,"%04u-%02u-%02uT%02u:%02u:%02u.%u",(ulong)time->Year,
           (ulong)time->Month,(ulong)time->Day,(ulong)time->Hour,(ulong)time->Minute,
           (ulong)time->Second,(ulong)time->Nanosecond);
  return __return_storage_ptr__;
}

Assistant:

UString efiTimeToUString(const EFI_TIME & time)
{
    return usprintf("%04u-%02u-%02uT%02u:%02u:%02u.%u",
                    time.Year,
                    time.Month,
                    time.Day,
                    time.Hour,
                    time.Minute,
                    time.Second,
                    time.Nanosecond);
}